

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowFrequencyOscillator.hpp
# Opt level: O0

void __thiscall Yamaha::OPL::LowFrequencyOscillator::update(LowFrequencyOscillator *this)

{
  int local_1c [2];
  int tremolo_levels [2];
  int tremolo_index;
  LowFrequencyOscillator *this_local;
  
  stack0xfffffffffffffff0 = this;
  this->counter = this->counter + 1;
  tremolo_levels[0] = (this->counter >> 6) % 0xd2;
  local_1c[0] = tremolo_levels[0] >> 2;
  local_1c[1] = 0x34 - (tremolo_levels[0] + 1 >> 2);
  this->tremolo = local_1c[tremolo_levels[0] / 0x6b];
  this->vibrato = this->counter >> 10 & 7;
  return;
}

Assistant:

void update() {
			++counter;

			// This produces output of:
			//
			// four instances of 0, four instances of 1... _three_ instances of 26,
			// four instances of 25, four instances of 24... _three_ instances of 0.
			//
			// ... advancing once every 64th update.
			const int tremolo_index = (counter >> 6) % 210;
			const int tremolo_levels[2] = {tremolo_index >> 2, 52 - ((tremolo_index+1) >> 2)};
			tremolo = tremolo_levels[tremolo_index / 107];

			// Vibrato is relatively simple: it's just three bits from the counter.
			vibrato = (counter >> 10) & 7;
		}